

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_direct.cpp
# Opt level: O0

void __thiscall
direct_solvers_lower_upper_factorisation_not_factorised_Test::
direct_solvers_lower_upper_factorisation_not_factorised_Test
          (direct_solvers_lower_upper_factorisation_not_factorised_Test *this)

{
  direct_solvers_lower_upper_factorisation_not_factorised_Test *this_local;
  
  direct_solvers::direct_solvers(&this->super_direct_solvers);
  (this->super_direct_solvers).super_Test._vptr_Test =
       (_func_int **)&PTR__direct_solvers_lower_upper_factorisation_not_factorised_Test_001a4640;
  return;
}

Assistant:

TEST_F(direct_solvers, lower_upper_factorisation_not_factorised) {

  Vector_Dense<Scalar, 0> b_vector = {6, 2, 7};
  Vector_Dense<Scalar, 0> x_vector = {0, 0, 0};
  Matrix_Dense<Scalar, 0, 0> matrix = {{0, 0, 0}, {9, 5, 1}, {4, 3, 8}};  // singular.

  EXPECT_FALSE(lu_solver.factorise(matrix));
  EXPECT_FALSE(lup_solver.factorise(matrix));

  EXPECT_FALSE(lu_solver.solve_system(x_vector, b_vector).converged);
  EXPECT_FALSE(lup_solver.solve_system(x_vector, b_vector).converged);
}